

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O3

void EvpathNotifyConnFailure(CP_Services Svcs,DP_RS_Stream Stream_v,int FailedPeerRank)

{
  CManager p_Var1;
  uint *puVar2;
  bool bVar3;
  
  p_Var1 = (*Svcs->getCManager)(*(void **)((long)Stream_v + 8));
  (*Svcs->verbose)(*(void **)((long)Stream_v + 8),4,
                   "received notification that writer peer %d has failed, failing any pending requests\n"
                   ,(ulong)(uint)FailedPeerRank);
  (*Svcs->verbose)(*(void **)((long)Stream_v + 8),5,
                   "Fail pending requests to rank %d on stream %p\n",(ulong)(uint)FailedPeerRank,
                   Stream_v);
  pthread_mutex_lock((pthread_mutex_t *)((long)Stream_v + 0x18));
  puVar2 = *(uint **)((long)Stream_v + 0x58);
  if (puVar2 != (uint *)0x0) {
    bVar3 = true;
    do {
      while ((puVar2[10] == 1 || (puVar2[0xb] != FailedPeerRank))) {
        puVar2 = *(uint **)(puVar2 + 0x10);
        if (puVar2 == (uint *)0x0) {
          if (bVar3) goto LAB_0010af66;
          goto LAB_0010aee2;
        }
      }
      puVar2[10] = 1;
      bVar3 = false;
      (*Svcs->verbose)(*(void **)(puVar2 + 4),5,
                       "Found a pending remote memory read to writer rank %d, marking as failed and signalling condition %d\n"
                       ,(ulong)(uint)FailedPeerRank,(ulong)*puVar2);
      CMCondition_signal(p_Var1,*puVar2);
      (*Svcs->verbose)(*(void **)(puVar2 + 4),5,"Did the signal of condition %d\n",
                       (ulong)puVar2[0xb],(ulong)*puVar2);
      puVar2 = *(uint **)(puVar2 + 0x10);
    } while (puVar2 != (uint *)0x0);
LAB_0010aee2:
    puVar2 = *(uint **)((long)Stream_v + 0x58);
    (*Svcs->verbose)(*(void **)((long)Stream_v + 8),5,
                     "We were waiting for requests on rank %d, fail *all* pending requests on stream %p\n"
                     ,(ulong)(uint)FailedPeerRank,Stream_v);
    for (; puVar2 != (uint *)0x0; puVar2 = *(uint **)(puVar2 + 0x10)) {
      if (puVar2[10] != 1) {
        puVar2[10] = 1;
        (*Svcs->verbose)(*(void **)(puVar2 + 4),5,
                         "Found a pending remote memory read to writer rank %d, marking as failed and signalling condition %d\n"
                         ,(ulong)puVar2[0xb],(ulong)*puVar2);
        CMCondition_signal(p_Var1,*puVar2);
        (*Svcs->verbose)(*(void **)(puVar2 + 4),5,"Did the signal of condition %d\n",
                         (ulong)puVar2[0xb],(ulong)*puVar2);
      }
    }
  }
LAB_0010af66:
  pthread_mutex_unlock((pthread_mutex_t *)((long)Stream_v + 0x18));
  (*Svcs->verbose)(*(void **)((long)Stream_v + 8),4,
                   "Done Failing requests to writer %d from stream %p\n",(ulong)(uint)FailedPeerRank
                   ,Stream_v,Svcs->verbose);
  return;
}

Assistant:

static void EvpathNotifyConnFailure(CP_Services Svcs, DP_RS_Stream Stream_v, int FailedPeerRank)
{
    Evpath_RS_Stream Stream =
        (Evpath_RS_Stream)Stream_v; /* DP_RS_Stream is the return from InitReader */
    CManager cm = Svcs->getCManager(Stream->CP_Stream);
    Svcs->verbose(Stream->CP_Stream, DPPerRankVerbose,
                  "received notification that writer peer "
                  "%d has failed, failing any pending "
                  "requests\n",
                  FailedPeerRank);
    FailRequestsToRank(Svcs, cm, Stream, FailedPeerRank);
}